

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

bool __thiscall
pybind11::detail::argument_loader<pybind11::detail::value_and_holder&,int,int,int>::
load_impl_sequence<0ul,1ul,2ul,3ul>(void *param_1,long param_2)

{
  bool bVar1;
  __tuple_element_t<0UL,_tuple<type_caster<value_and_holder>,_type_caster<int,_void>,_type_caster<int,_void>,_type_caster<int,_void>_>_>
  *__n;
  reference pvVar2;
  reference rVar3;
  undefined8 in_stack_ffffffffffffff60;
  undefined1 uVar4;
  type_caster<pybind11::detail::value_and_holder,_void> *in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  byte bVar5;
  reference local_78;
  PyObject *local_68;
  _Bit_reference in_stack_ffffffffffffffa0;
  undefined1 convert;
  type_caster<int,_void> *in_stack_ffffffffffffffb0;
  PyObject *this;
  handle src;
  reference local_30;
  PyObject *local_20;
  long local_18;
  void *local_10;
  
  convert = in_stack_ffffffffffffffa0._M_mask._7_1_;
  uVar4 = (undefined1)((ulong)in_stack_ffffffffffffff60 >> 0x38);
  local_18 = param_2;
  local_10 = param_1;
  __n = std::
        get<0ul,pybind11::detail::type_caster<pybind11::detail::value_and_holder,void>,pybind11::detail::type_caster<int,void>,pybind11::detail::type_caster<int,void>,pybind11::detail::type_caster<int,void>>
                  ((tuple<pybind11::detail::type_caster<pybind11::detail::value_and_holder,_void>,_pybind11::detail::type_caster<int,_void>,_pybind11::detail::type_caster<int,_void>,_pybind11::detail::type_caster<int,_void>_>
                    *)0x1ab989);
  pvVar2 = std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
                     ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)(local_18 + 8),
                      0);
  local_20 = pvVar2->m_ptr;
  local_30 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       ((vector<bool,_std::allocator<bool>_> *)
                        CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),(size_type)__n
                       );
  std::_Bit_reference::operator_cast_to_bool(&local_30);
  bVar1 = type_caster<pybind11::detail::value_and_holder,_void>::load
                    (in_stack_ffffffffffffff68,(handle)param_1,(bool)uVar4);
  bVar5 = 1;
  if (bVar1) {
    std::
    get<1ul,pybind11::detail::type_caster<pybind11::detail::value_and_holder,void>,pybind11::detail::type_caster<int,void>,pybind11::detail::type_caster<int,void>,pybind11::detail::type_caster<int,void>>
              ((tuple<pybind11::detail::type_caster<pybind11::detail::value_and_holder,_void>,_pybind11::detail::type_caster<int,_void>,_pybind11::detail::type_caster<int,_void>,_pybind11::detail::type_caster<int,_void>_>
                *)0x1aba0e);
    std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
              ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)(local_18 + 8),1);
    rVar3 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      ((vector<bool,_std::allocator<bool>_> *)
                       CONCAT17(bVar5,in_stack_ffffffffffffff80),(size_type)__n);
    src.m_ptr = (PyObject *)rVar3._M_p;
    std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&stack0xffffffffffffffb8);
    bVar1 = type_caster<int,_void>::load(in_stack_ffffffffffffffb0,src,(bool)convert);
    bVar5 = 1;
    if (bVar1) {
      std::
      get<2ul,pybind11::detail::type_caster<pybind11::detail::value_and_holder,void>,pybind11::detail::type_caster<int,void>,pybind11::detail::type_caster<int,void>,pybind11::detail::type_caster<int,void>>
                ((tuple<pybind11::detail::type_caster<pybind11::detail::value_and_holder,_void>,_pybind11::detail::type_caster<int,_void>,_pybind11::detail::type_caster<int,_void>,_pybind11::detail::type_caster<int,_void>_>
                  *)0x1aba8c);
      pvVar2 = std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
                         ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)
                          (local_18 + 8),2);
      this = pvVar2->m_ptr;
      rVar3 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        ((vector<bool,_std::allocator<bool>_> *)
                         CONCAT17(bVar5,in_stack_ffffffffffffff80),(size_type)__n);
      uVar4 = rVar3._M_mask._7_1_;
      std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&stack0xffffffffffffffa0);
      bVar1 = type_caster<int,_void>::load((type_caster<int,_void> *)this,src,(bool)uVar4);
      bVar5 = 1;
      if (bVar1) {
        std::
        get<3ul,pybind11::detail::type_caster<pybind11::detail::value_and_holder,void>,pybind11::detail::type_caster<int,void>,pybind11::detail::type_caster<int,void>,pybind11::detail::type_caster<int,void>>
                  ((tuple<pybind11::detail::type_caster<pybind11::detail::value_and_holder,_void>,_pybind11::detail::type_caster<int,_void>,_pybind11::detail::type_caster<int,_void>,_pybind11::detail::type_caster<int,_void>_>
                    *)0x1abb07);
        pvVar2 = std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
                           ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)
                            (local_18 + 8),3);
        local_68 = pvVar2->m_ptr;
        local_78 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             ((vector<bool,_std::allocator<bool>_> *)
                              CONCAT17(bVar5,in_stack_ffffffffffffff80),(size_type)__n);
        std::_Bit_reference::operator_cast_to_bool(&local_78);
        bVar1 = type_caster<int,_void>::load((type_caster<int,_void> *)this,src,(bool)uVar4);
        bVar5 = bVar1 ^ 0xff;
      }
    }
  }
  return (bVar5 & 1) == 0;
}

Assistant:

bool load_impl_sequence(function_call &call, index_sequence<Is...>) {
#ifdef __cpp_fold_expressions
        if ((... || !std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])))
            return false;
#else
        for (bool r : {std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])...})
            if (!r)
                return false;
#endif
        return true;
    }